

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O3

uint32 __thiscall MTRand::randInt(MTRand *this)

{
  ulong *puVar1;
  int iVar2;
  ulong uVar3;
  
  iVar2 = this->left;
  if (iVar2 == 0) {
    reload(this);
    iVar2 = this->left;
  }
  this->left = iVar2 + -1;
  puVar1 = this->pNext;
  this->pNext = puVar1 + 1;
  uVar3 = *puVar1;
  uVar3 = uVar3 >> 0xb ^ uVar3;
  uVar3 = ((uint)uVar3 & 0x13a58ad) << 7 ^ uVar3;
  uVar3 = ((uint)uVar3 & 0x1df8c) << 0xf ^ uVar3;
  return uVar3 >> 0x12 ^ uVar3;
}

Assistant:

MTRand::uint32 MTRand::randInt() {
  // Pull a 32-bit integer from the generator state
  // Every other access function simply transforms the numbers extracted here

  if (left == 0)
    reload();
  --left;

  uint32 s1;
  s1 = *pNext++;
  s1 ^= (s1 >> 11);
  s1 ^= (s1 << 7) & 0x9d2c5680UL;
  s1 ^= (s1 << 15) & 0xefc60000UL;
  return (s1 ^ (s1 >> 18));
}